

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

size_t dlbulk_free(void **array,size_t nelem)

{
  mstate m;
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  mchunkptr p;
  long lVar6;
  bool bVar7;
  size_t psize;
  
  p = (mchunkptr)nelem;
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar7 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar7) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  lVar6 = 0;
  do {
    if (nelem << 3 == lVar6) {
      if (_gm_.trim_check < _gm_.topsize) {
        sys_trim((mstate)0x0,(size_t)p);
      }
      if (((byte)_gm_.mflags & 2) != 0) {
        _gm_.mutex = 0;
      }
      return 0;
    }
    lVar2 = *(long *)((long)array + lVar6);
    if (lVar2 != 0) {
      uVar5 = *(ulong *)(lVar2 + -8);
      *(undefined8 *)((long)array + lVar6) = 0;
      m = (mstate)(lVar2 + -0x10);
      if (m < _gm_.least_addr) {
LAB_00106a8d:
        abort();
      }
      uVar3 = (uint)uVar5;
      uVar4 = uVar3 & 3;
      psize = (size_t)uVar4;
      if (uVar4 == 1) goto LAB_00106a8d;
      p = (mchunkptr)(uVar5 & 0xfffffffffffffff8);
      if ((nelem * 8 + -8 == lVar6) ||
         (psize = (long)&p->prev_foot + (long)(m->smallbins + -7),
         *(size_t *)((long)array + lVar6 + 8) != psize)) {
        dispose_chunk(m,p,psize);
      }
      else {
        uVar5 = *(ulong *)(lVar2 + -8 + (long)p) & 0xfffffffffffffff8;
        *(ulong *)(lVar2 + -8) = (long)&p->prev_foot + (uVar3 & 1) + uVar5 + 2;
        pbVar1 = (byte *)((long)p + lVar2 + -8 + uVar5);
        *pbVar1 = *pbVar1 | 1;
        *(long *)((long)array + lVar6 + 8) = lVar2;
      }
    }
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

size_t dlbulk_free(void* array[], size_t nelem) {
  return internal_bulk_free(gm, array, nelem);
}